

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::RAPass::formatInlineComment(RAPass *this,StringBuilder *dst,CBNode *node)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  long in_RDX;
  long *in_RSI;
  size_t in_RDI;
  char c;
  uint32_t flags;
  VirtReg *vreg;
  TiedReg *tied;
  TiedReg *tiedArray;
  uint32_t tiedTotal;
  uint32_t i;
  RABits *liveness;
  size_t offset;
  uint32_t vdCount;
  RAData *wd;
  char *in_stack_000002d0;
  int in_stack_000002dc;
  char *in_stack_000002e0;
  char in_stack_fffffffffffffee3;
  char cVar8;
  uint32_t in_stack_fffffffffffffee4;
  StringBuilder *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  uint32_t in_stack_ffffffffffffff04;
  uint uVar9;
  uint uVar10;
  StringBuilder *in_stack_ffffffffffffff08;
  
  plVar3 = *(long **)(in_RDX + 0x20);
  if (*(long *)(in_RDX + 0x18) != 0) {
    StringBuilder::_opString
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0);
  }
  if ((plVar3 != (long *)0x0) && (*plVar3 != 0)) {
    if ((ulong)in_RSI[1] < (ulong)*(uint *)(in_RDI + 0x120)) {
      StringBuilder::_opChars
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee3,
                 in_RDI);
    }
    uVar4 = *(undefined8 *)(in_RDI + 0xd0);
    lVar6 = in_RSI[1] + 1;
    StringBuilder::_opChar
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee3);
    StringBuilder::_opChars
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee3,in_RDI)
    ;
    StringBuilder::_opChar
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee3);
    lVar5 = *plVar3;
    for (uVar9 = 0; uVar9 < (uint)uVar4; uVar9 = uVar9 + 1) {
      if ((*(ulong *)(lVar5 + (ulong)(uVar9 >> 6) * 8) >> ((byte)uVar9 & 0x3f) & 1) != 0) {
        *(undefined1 *)(*in_RSI + lVar6 + (ulong)uVar9) = 0x2e;
      }
    }
    uVar9 = *(uint *)(plVar3 + 2);
    uVar1 = *(uint *)(in_RDI + 0x90);
    for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
      plVar7 = (long *)((long)plVar3 + (ulong)uVar10 * 0x18 + (ulong)uVar1);
      lVar5 = *plVar7;
      uVar2 = *(uint *)(plVar7 + 1);
      cVar8 = 'u';
      if (((uVar2 & 0x515) != 0) && ((uVar2 & 0x22a) == 0)) {
        cVar8 = 'r';
      }
      if (((uVar2 & 0x515) == 0) && ((uVar2 & 0x22a) != 0)) {
        cVar8 = 'w';
      }
      if (((uVar2 & 0x515) != 0) && ((uVar2 & 0x22a) != 0)) {
        cVar8 = 'x';
      }
      if ((uVar2 & 0x1000) != 0) {
        cVar8 = cVar8 + -0x20;
      }
      if ((ulong)in_RSI[1] <= lVar6 + (ulong)*(uint *)(lVar5 + 0x18)) {
        DebugUtils::assertionFailed(in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
      }
      *(char *)(*in_RSI + lVar6 + (ulong)*(uint *)(lVar5 + 0x18)) = cVar8;
    }
  }
  return 0;
}

Assistant:

Error RAPass::formatInlineComment(StringBuilder& dst, CBNode* node) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  RAData* wd = node->getPassData<RAData>();

  if (node->hasInlineComment())
    dst.appendString(node->getInlineComment());

  if (wd && wd->liveness) {
    if (dst.getLength() < _annotationLength)
      dst.appendChars(' ', _annotationLength - dst.getLength());

    uint32_t vdCount = static_cast<uint32_t>(_contextVd.getLength());
    size_t offset = dst.getLength() + 1;

    dst.appendChar('[');
    dst.appendChars(' ', vdCount);
    dst.appendChar(']');
    RABits* liveness = wd->liveness;

    uint32_t i;
    for (i = 0; i < vdCount; i++) {
      if (liveness->getBit(i))
        dst.getData()[offset + i] = '.';
    }

    uint32_t tiedTotal = wd->tiedTotal;
    TiedReg* tiedArray = reinterpret_cast<TiedReg*>(((uint8_t*)wd) + _varMapToVaListOffset);

    for (i = 0; i < tiedTotal; i++) {
      TiedReg* tied = &tiedArray[i];
      VirtReg* vreg = tied->vreg;
      uint32_t flags = tied->flags;

      char c = 'u';
      if ( (flags & TiedReg::kRAll) && !(flags & TiedReg::kWAll)) c = 'r';
      if (!(flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'w';
      if ( (flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'x';
      // Uppercase if unused.
      if ( (flags & TiedReg::kUnuse)) c -= 'a' - 'A';

      ASMJIT_ASSERT(offset + vreg->_raId < dst.getLength());
      dst._data[offset + vreg->_raId] = c;
    }
  }
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}